

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Algorithms.cpp
# Opt level: O1

void Corrade::Utility::Implementation::flipSecondToLastDimensionInPlace
               (StridedArrayView4D<char> *view)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  ErasedType *pEVar3;
  long lVar4;
  ulong uVar5;
  unsigned_long uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  long lVar10;
  long lVar11;
  ostream *output;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  void *__src;
  long lVar15;
  long lVar16;
  char tmp [32];
  unsigned_long local_b8;
  unsigned_long local_b0;
  Error local_80 [2];
  
  if ((view->_stride)._data[3] == 1) {
    if ((view->_size)._data[0] != 0) {
      pEVar3 = view->_data;
      local_b8 = 0;
      do {
        if ((view->_size)._data[1] != 0) {
          lVar4 = (view->_stride)._data[0];
          local_b0 = 0;
          do {
            uVar5 = (view->_size)._data[2];
            if (1 < uVar5) {
              lVar10 = (long)pEVar3 + (view->_stride)._data[1] * local_b0 + lVar4 * local_b8;
              lVar15 = -1;
              uVar14 = 0;
              do {
                uVar6 = (view->_size)._data[2];
                lVar11 = (view->_stride)._data[2];
                lVar16 = lVar11 * uVar14;
                uVar12 = (view->_size)._data[3];
                lVar13 = lVar10;
                if (uVar12 < 0x20) {
                  __src = (void *)((uVar6 + ~uVar14) * lVar11 + lVar10);
                }
                else {
                  uVar12 = uVar12 >> 5;
                  lVar11 = lVar11 * (uVar6 + lVar15);
                  do {
                    local_80[0].super_Debug._output = *(ostream **)(lVar13 + lVar16);
                    local_80[0].super_Debug._8_8_ = ((undefined8 *)(lVar13 + lVar16))[1];
                    puVar1 = (undefined8 *)(lVar13 + lVar16 + 0x10);
                    local_80[0].super_Debug._sourceLocationFile = (char *)*puVar1;
                    local_80[0].super_Debug._previousGlobalOutput = (ostream *)puVar1[1];
                    uVar7 = *(undefined8 *)(lVar13 + lVar11);
                    uVar8 = ((undefined8 *)(lVar13 + lVar11))[1];
                    puVar1 = (undefined8 *)(lVar13 + lVar11 + 0x10);
                    uVar9 = puVar1[1];
                    puVar2 = (undefined8 *)(lVar13 + lVar16 + 0x10);
                    *puVar2 = *puVar1;
                    puVar2[1] = uVar9;
                    *(undefined8 *)(lVar13 + lVar16) = uVar7;
                    ((undefined8 *)(lVar13 + lVar16))[1] = uVar8;
                    puVar1 = (undefined8 *)(lVar13 + lVar11 + 0x10);
                    *puVar1 = local_80[0].super_Debug._sourceLocationFile;
                    puVar1[1] = local_80[0].super_Debug._previousGlobalOutput;
                    *(undefined8 *)(lVar13 + lVar11) = local_80[0].super_Debug._output;
                    ((undefined8 *)(lVar13 + lVar11))[1] = local_80[0].super_Debug._8_8_;
                    lVar13 = lVar13 + 0x20;
                    uVar12 = uVar12 - 1;
                  } while (uVar12 != 0);
                  __src = (void *)(lVar11 + lVar13);
                }
                uVar12 = (ulong)((uint)(view->_size)._data[3] & 0x1f);
                memcpy(local_80,(void *)(lVar16 + lVar13),uVar12);
                memcpy((void *)(lVar16 + lVar13),__src,uVar12);
                memcpy(__src,local_80,uVar12);
                uVar14 = uVar14 + 1;
                lVar15 = lVar15 + -1;
              } while (uVar14 != uVar5 >> 1);
            }
            local_b0 = local_b0 + 1;
          } while (local_b0 != (view->_size)._data[1]);
        }
        local_b8 = local_b8 + 1;
      } while (local_b8 != (view->_size)._data[0]);
    }
    return;
  }
  output = Error::defaultOutput();
  Error::Error(local_80,output,(Flags)0x0);
  Debug::operator<<(&local_80[0].super_Debug,
                    "Assertion view.isContiguous<3>() failed at /workspace/llm4binary/github/license_c_cmakelists/mosra[P]corrade/src/Corrade/Utility/Algorithms.cpp:232"
                   );
  Error::~Error(local_80);
  abort();
}

Assistant:

void flipSecondToLastDimensionInPlace(const Containers::StridedArrayView4D<char>& view) {
    /* Should have been checked by flipInPlace() already, just verifying that
       all the bubbling back to four dimensions went correct */
    CORRADE_INTERNAL_ASSERT(view.isContiguous<3>());

    auto* const ptr = static_cast<char*>(view.data());
    const std::size_t* size = view.size().begin();
    const std::ptrdiff_t* stride = view.stride().begin();

    for(std::size_t i0 = 0; i0 != size[0]; ++i0) {
        char* const ptr0 = ptr + i0*stride[0];
        for(std::size_t i1 = 0; i1 != size[1]; ++i1) {
            char* const ptr1 = ptr0 + i1*stride[1];

            /* Go through half of the items in third dimension and flip them
               with the other half */
            for(std::size_t i2 = 0, i2Max = size[2]/2; i2 != i2Max; ++i2) {
                char* const ptr2Left = ptr1 + i2*stride[2];
                char* const ptr2Right = ptr1 + (size[2] - i2 - 1)*stride[2];

                /* Copy 256-bit blocks at a time, which could hopefully make
                   use of 256-bit SIMD */
                constexpr std::size_t BlockSize = 32;
                alignas(BlockSize) char tmp[BlockSize];
                char* ptr3Left = ptr2Left;
                char* ptr3Right = ptr2Right;
                for(std::size_t i3 = 0, i3Max = size[3]/BlockSize; i3 != i3Max; ++i3) {
                    std::memcpy(tmp, ptr3Left, BlockSize);
                    std::memcpy(ptr3Left, ptr3Right, BlockSize);
                    std::memcpy(ptr3Right, tmp, BlockSize);

                    ptr3Left += BlockSize;
                    ptr3Right += BlockSize;
                }

                /* Copy the rest. I doubt an if() around this makes sense,
                   since it would slow down the very common and very slow case
                   where we're flipping pieces of data smaller than 256 bits */
                const std::size_t remainingSize = size[3]%BlockSize;
                std::memcpy(tmp, ptr3Left, remainingSize);
                std::memcpy(ptr3Left, ptr3Right, remainingSize);
                std::memcpy(ptr3Right, tmp, remainingSize);
            }
        }
    }
}